

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int checkRef(IntegrityCk *pCheck,Pgno iPage)

{
  int iVar1;
  uint in_ESI;
  IntegrityCk *in_RDI;
  int local_4;
  
  if (in_ESI == 0) {
    local_4 = 1;
  }
  else if (in_RDI->nPage < in_ESI) {
    checkAppendMsg(in_RDI,"invalid page number %d",(ulong)in_ESI);
    local_4 = 1;
  }
  else {
    iVar1 = getPageReferenced(in_RDI,in_ESI);
    if (iVar1 == 0) {
      setPageReferenced(in_RDI,in_ESI);
      local_4 = 0;
    }
    else {
      checkAppendMsg(in_RDI,"2nd reference to page %d",(ulong)in_ESI);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int checkRef(IntegrityCk *pCheck, Pgno iPage){
  if( iPage==0 ) return 1;
  if( iPage>pCheck->nPage ){
    checkAppendMsg(pCheck, "invalid page number %d", iPage);
    return 1;
  }
  if( getPageReferenced(pCheck, iPage) ){
    checkAppendMsg(pCheck, "2nd reference to page %d", iPage);
    return 1;
  }
  setPageReferenced(pCheck, iPage);
  return 0;
}